

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_format.cc
# Opt level: O2

char * absl::lts_20240722::time_internal::cctz::detail::anon_unknown_0::ParseSubSeconds
                 (char *dp,femtoseconds *subseconds)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int_fast64_t exp;
  long lVar5;
  
  if (dp != (char *)0x0) {
    lVar3 = 0;
    lVar4 = 0;
    lVar5 = 0;
    while ((pvVar2 = memchr("0123456789",(int)dp[lVar3],0xb), pvVar2 != (void *)0x0 &&
           (iVar1 = (int)pvVar2 + -0x1152d4, iVar1 < 10))) {
      if (lVar5 < 0xf) {
        lVar5 = lVar5 + 1;
        lVar4 = (long)iVar1 + lVar4 * 10;
      }
      lVar3 = lVar3 + 1;
    }
    if (lVar3 != 0) {
      subseconds->__r = lVar4 * *(long *)((anonymous_namespace)::kExp10 + (0xf - lVar5) * 8);
      return dp + lVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParseSubSeconds(const char* dp, detail::femtoseconds* subseconds) {
  if (dp != nullptr) {
    std::int_fast64_t v = 0;
    std::int_fast64_t exp = 0;
    const char* const bp = dp;
    while (const char* cp = strchr(kDigits, *dp)) {
      int d = static_cast<int>(cp - kDigits);
      if (d >= 10) break;
      if (exp < 15) {
        exp += 1;
        v *= 10;
        v += d;
      }
      ++dp;
    }
    if (dp != bp) {
      v *= kExp10[15 - exp];
      *subseconds = detail::femtoseconds(v);
    } else {
      dp = nullptr;
    }
  }
  return dp;
}